

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

string_view __thiscall google::protobuf::io::Printer::LookupVar(Printer *this,string_view var)

{
  size_t *psVar1;
  char **ppcVar2;
  bool bVar3;
  ValueImpl<false> *this_00;
  LogMessage *pLVar4;
  size_type in_R9;
  string_view sVar5;
  string_view var_00;
  Span<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames;
  LogMessage local_108;
  Voidify local_f1;
  StringType *local_f0;
  StringType *view;
  char *pcStack_e0;
  byte local_cd;
  LogMessage local_c0;
  Voidify local_a9;
  Span<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_a8;
  StringType *local_98;
  char *local_90;
  undefined1 local_88 [8];
  optional<google::protobuf::io::Printer::ValueImpl<false>_> result;
  Printer *this_local;
  string_view var_local;
  
  local_98 = (StringType *)var._M_len;
  local_90 = var._M_str;
  result.super__Optional_base<google::protobuf::io::Printer::ValueImpl<false>,_false,_false>.
  _M_payload.
  super__Optional_payload<google::protobuf::io::Printer::ValueImpl<false>,_true,_false,_false>.
  super__Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>._80_8_ = this;
  local_a8 = absl::lts_20250127::
             MakeSpan<std::vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                       (&this->var_lookups_);
  var_00._M_str = (char *)local_a8.ptr_;
  var_00._M_len = (size_t)local_90;
  frames.len_ = in_R9;
  frames.ptr_ = (pointer)local_a8.len_;
  io::(anonymous_namespace)::LookupInFrameStack<google::protobuf::io::Printer::ValueImpl<false>>
            ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)local_88,
             (_anonymous_namespace_ *)local_98,var_00,frames);
  bVar3 = std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::has_value
                    ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)local_88);
  local_cd = 0;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
               ,0x132,"result.has_value()");
    local_cd = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [16])"could not find ");
    view = (StringType *)var._M_len;
    pcStack_e0 = var._M_str;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,var);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar4);
  }
  if ((local_cd & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_c0);
  }
  this_00 = std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::operator->
                      ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)local_88);
  local_f0 = ValueImpl<false>::AsString(this_00);
  if (local_f0 == (StringType *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
               ,0x135,"view != nullptr");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_108);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [16])"could not find ");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,var);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [25])"; found callback instead");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_f1,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_108);
  }
  psVar1 = &local_f0->_M_len;
  ppcVar2 = &local_f0->_M_str;
  std::optional<google::protobuf::io::Printer::ValueImpl<false>_>::~optional
            ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)local_88);
  sVar5._M_len = *psVar1;
  sVar5._M_str = *ppcVar2;
  return sVar5;
}

Assistant:

absl::string_view Printer::LookupVar(absl::string_view var) {
  auto result = LookupInFrameStack(var, absl::MakeSpan(var_lookups_));
  ABSL_CHECK(result.has_value()) << "could not find " << var;

  auto* view = result->AsString();
  ABSL_CHECK(view != nullptr)
      << "could not find " << var << "; found callback instead";

  return *view;
}